

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

void __thiscall
Sudoku::FurtherWays::addWay
          (FurtherWays *this,int index,int posX,int posY,int posZ,int value,Reason reason)

{
  Way local_18;
  
  local_18.reason = reason;
  local_18.index = index;
  local_18.posX = posX;
  local_18.posY = posY;
  local_18.posZ = posZ;
  local_18.value = value;
  std::
  _Rb_tree<Sudoku::FurtherWays::Way,Sudoku::FurtherWays::Way,std::_Identity<Sudoku::FurtherWays::Way>,std::less<Sudoku::FurtherWays::Way>,std::allocator<Sudoku::FurtherWays::Way>>
  ::_M_insert_unique<Sudoku::FurtherWays::Way_const&>
            ((_Rb_tree<Sudoku::FurtherWays::Way,Sudoku::FurtherWays::Way,std::_Identity<Sudoku::FurtherWays::Way>,std::less<Sudoku::FurtherWays::Way>,std::allocator<Sudoku::FurtherWays::Way>>
              *)&this->ways,&local_18);
  return;
}

Assistant:

void Sudoku::FurtherWays::addWay(int index, int posX, int posY, int posZ, int value, Sudoku::FurtherWays::Reason reason)
{
  Way way;
  way.index = index;
  way.posX = posX;
  way.posY = posY;
  way.posZ = posZ;
  way.value = value;
  way.reason = reason;
  ways.insert(way);
}